

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O2

void __thiscall
ritobin::io::text_write_impl::TextWriter::write<unsigned_short>
          (TextWriter *this,unsigned_short value)

{
  unsigned_short value_local;
  string result;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  value_local = value;
  from_num<unsigned_short>(&result,&value_local,10);
  std::vector<char,std::allocator<char>>::
  insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<char,std::allocator<char>> *)this->buffer_,
             (const_iterator)*(char **)((vector<char,std::allocator<char>> *)this->buffer_ + 8),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )result._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(result._M_dataplus._M_p + result._M_string_length));
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void write(T value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            std::string result;
            from_num(result, value);
            buffer_.insert(buffer_.end(), result.begin(), result.end());
        }